

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

bool reciprocal_check(double a,double b)

{
  long lVar1;
  char *pcVar2;
  
  if (a <= 0.0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," \n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"RECIPROCAL_CHECK - Warning!\n",0x1c);
    pcVar2 = "  A <= 0.0\n";
    lVar1 = 0xb;
  }
  else {
    if (a <= b) {
      return true;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," \n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"RECIPROCAL_CHECK - Warning!\n",0x1c);
    pcVar2 = "  B < A\n";
    lVar1 = 8;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,lVar1);
  return false;
}

Assistant:

bool reciprocal_check ( double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    RECIPROCAL_CHECK checks the parameters of the Reciprocal CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < A <= B.
//
//    Output, bool RECIPROCAL_CHECK, is true if the parameters are legal.
//
{
  if ( a <= 0.0 )
  {
    cout << " \n";
    cout << "RECIPROCAL_CHECK - Warning!\n";
    cout << "  A <= 0.0\n";
    return false;
  }

  if ( b < a )
  {
    cout << " \n";
    cout << "RECIPROCAL_CHECK - Warning!\n";
    cout << "  B < A\n";
    return false;
  }

  return true;
}